

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O3

void __thiscall
solitaire::graphics::
SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLCreateTextureFromSurfaceFailedDuringLoadTexture_Test
::TestBody(SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLCreateTextureFromSurfaceFailedDuringLoadTexture_Test
           *this)

{
  VTable **ppVVar1;
  uint uVar2;
  int iVar3;
  WrapperMock *pWVar4;
  PtrDeleterMock *this_00;
  bool bVar5;
  TypedExpectation<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_01;
  TypedExpectation<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
  *this_02;
  ActionInterface<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
  *impl;
  TypedExpectation<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
  *this_03;
  ActionInterface<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
  *impl_00;
  TypedExpectation<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
  *this_04;
  ActionInterface<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
  *impl_01;
  unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_> *x;
  _Any_data local_170;
  code *local_160;
  MatcherBase<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&> local_150;
  MatcherBase<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&> local_138;
  MockSpec<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
  local_120;
  MatcherBase<unsigned_char> local_b8;
  MatcherBase<unsigned_char> local_a0;
  uint *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  undefined8 local_78;
  UniquePtr<SDL_Surface> local_70;
  unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_> local_48;
  
  pWVar4 = &((this->super_SDLGraphicsSystemWithCreatedWindowTests).super_SDLGraphicsSystemTests.
             sdlMock.rawPointer)->super_WrapperMock;
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)&local_150,(string *)(anonymous_namespace)::texturePath_abi_cxx11_);
  SDL::WrapperMock::gmock_loadBMP
            ((MockSpec<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_120,pWVar4,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_150);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::InternalExpectedAt
                      ((MockSpec<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_120,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x10c,"*sdlMock","loadBMP(texturePath)");
  SDLGraphicsSystemWithCreatedWindowTests::makeSDLSurface
            (&local_70,&this->super_SDLGraphicsSystemWithCreatedWindowTests,(SDL_Surface *)0x5);
  testing::ByMove<std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>>
            ((ByMoveWrapper<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_> *)
             &local_48,(testing *)&local_70,x);
  testing::
  Return<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>>>
            ((testing *)&local_138,
             (ByMoveWrapper<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_> *)
             &local_48);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_170,(ReturnAction *)&local_138);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::WillOnce(this_01,(Action<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_170);
  if (local_160 != (code *)0x0) {
    (*local_160)(&local_170,&local_170,3);
  }
  if (local_138.vtable_ != (VTable *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.vtable_);
  }
  std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>::~unique_ptr(&local_48);
  std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>::~unique_ptr(&local_70);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&local_120.matchers_);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&local_150);
  pWVar4 = &((this->super_SDLGraphicsSystemWithCreatedWindowTests).super_SDLGraphicsSystemTests.
             sdlMock.rawPointer)->super_WrapperMock;
  local_78 = 5;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&> *)
             &local_150,(PointerMatcher *)&local_78);
  testing::Matcher<unsigned_char>::Matcher((Matcher<unsigned_char> *)&local_138,'\0');
  testing::Matcher<unsigned_char>::Matcher((Matcher<unsigned_char> *)&local_a0,0xff);
  testing::Matcher<unsigned_char>::Matcher((Matcher<unsigned_char> *)&local_b8,0xff);
  SDL::WrapperMock::gmock_mapRGB
            (&local_120,pWVar4,
             (Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&> *)
             &local_150,(Matcher<unsigned_char> *)&local_138,(Matcher<unsigned_char> *)&local_a0,
             (Matcher<unsigned_char> *)&local_b8);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
            ::InternalExpectedAt
                      (&local_120,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x10e,"*sdlMock","mapRGB(Pointer(surfacePtr), 0, 255, 255)");
  local_88 = (uint *)operator_new(4);
  *local_88 = 10;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<unsigned_int*>(&local_80,local_88)
  ;
  impl = (ActionInterface<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
          *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00329b38;
  uVar2 = *local_88;
  *(uint *)&impl[1]._vptr_ActionInterface = uVar2;
  *(uint *)((long)&impl[1]._vptr_ActionInterface + 4) = uVar2;
  testing::
  Action<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
  ::Action((Action<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
            *)&local_170,impl);
  testing::internal::
  TypedExpectation<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
  ::WillOnce(this_02,(Action<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
                      *)&local_170);
  if (local_160 != (code *)0x0) {
    (*local_160)(&local_170,&local_170,3);
  }
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>::
  ~MatcherBase((MatcherBase<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>
                *)&local_120.matchers_.
                   super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
                   .
                   super__Head_base<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_false>
              );
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase
            ((MatcherBase<unsigned_char> *)
             &local_120.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
              .super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase
            ((MatcherBase<unsigned_char> *)
             &local_120.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
              .
              super__Tuple_impl<2UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
              .super__Head_base<2UL,_testing::Matcher<unsigned_char>,_false>);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase
            ((MatcherBase<unsigned_char> *)&local_120.matchers_);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase(&local_b8);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase(&local_a0);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase
            ((MatcherBase<unsigned_char> *)&local_138);
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>::
  ~MatcherBase(&local_150);
  pWVar4 = &((this->super_SDLGraphicsSystemWithCreatedWindowTests).super_SDLGraphicsSystemTests.
             sdlMock.rawPointer)->super_WrapperMock;
  local_88 = (uint *)0x5;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&> *)
             &local_150,(PointerMatcher *)&local_88);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_138,1);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_a0,10);
  SDL::WrapperMock::gmock_setColorKey
            ((MockSpec<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
              *)&local_120,pWVar4,
             (Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&> *)
             &local_150,(Matcher<int> *)&local_138,(Matcher<unsigned_int> *)&local_a0);
  testing::internal::GetWithoutMatchers();
  this_03 = testing::internal::
            MockSpec<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
            ::InternalExpectedAt
                      ((MockSpec<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
                        *)&local_120,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x110,"*sdlMock","setColorKey(Pointer(surfacePtr), SDL_TRUE, mapRGBResult)")
  ;
  local_b8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)operator_new(4);
  *(int *)local_b8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8.vtable_,
             (int *)local_b8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  impl_00 = (ActionInterface<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
             *)operator_new(0x10);
  impl_00->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00329ce8;
  iVar3 = *(int *)local_b8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
  *(int *)&impl_00[1]._vptr_ActionInterface = iVar3;
  *(int *)((long)&impl_00[1]._vptr_ActionInterface + 4) = iVar3;
  testing::
  Action<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
  ::Action((Action<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
            *)&local_170,impl_00);
  testing::internal::
  TypedExpectation<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
  ::WillOnce(this_03,(Action<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
                      *)&local_170);
  if (local_160 != (code *)0x0) {
    (*local_160)(&local_170,&local_170,3);
  }
  if (local_b8.vtable_ != (VTable *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.vtable_);
  }
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>::
  ~MatcherBase((MatcherBase<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>
                *)&local_120.matchers_.
                   super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
                   .
                   super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
                   .super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>);
  testing::internal::MatcherBase<int>::~MatcherBase
            ((MatcherBase<int> *)
             &local_120.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
              .
              super__Tuple_impl<2UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
              .super__Head_base<2UL,_testing::Matcher<unsigned_char>,_false>);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)&local_120.matchers_);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase((MatcherBase<unsigned_int> *)&local_a0)
  ;
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&local_138);
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>::
  ~MatcherBase(&local_150);
  pWVar4 = &((this->super_SDLGraphicsSystemWithCreatedWindowTests).super_SDLGraphicsSystemTests.
             sdlMock.rawPointer)->super_WrapperMock;
  local_a0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)0x2;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)&local_150,(PointerMatcher *)&local_a0);
  local_b8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)0x5;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&> *)
             &local_138,(PointerMatcher *)&local_b8);
  SDL::WrapperMock::gmock_createTextureFromSurface
            ((MockSpec<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
              *)&local_120,pWVar4,
             (Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)&local_150,
             (Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&> *)
             &local_138);
  testing::internal::GetWithoutMatchers();
  this_04 = testing::internal::
            MockSpec<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
            ::InternalExpectedAt
                      ((MockSpec<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
                        *)&local_120,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x114,"*sdlMock",
                       "createTextureFromSurface(Pointer(rendererPtr), Pointer(surfacePtr))");
  impl_01 = (ActionInterface<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
             *)operator_new(0x10);
  impl_01->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0032a140;
  testing::
  Action<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
  ::Action((Action<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
            *)&local_170,impl_01);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
  ::WillOnce(this_04,(Action<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
                      *)&local_170);
  if (local_160 != (code *)0x0) {
    (*local_160)(&local_170,&local_170,3);
  }
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~MatcherBase((MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
                *)&local_120.matchers_.
                   super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
                   .
                   super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
                   .
                   super__Tuple_impl<2UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
                   .super__Head_base<2UL,_testing::Matcher<unsigned_char>,_false>);
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>::
  ~MatcherBase((MatcherBase<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>
                *)&local_120.matchers_);
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>::
  ~MatcherBase(&local_138);
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~MatcherBase((MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
                *)&local_150);
  this_00 = &((this->super_SDLGraphicsSystemWithCreatedWindowTests).super_SDLGraphicsSystemTests.
              ptrDeleterMock.
              super___shared_ptr<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super_PtrDeleterMock;
  testing::Matcher<SDL_Surface_*>::Matcher((Matcher<SDL_Surface_*> *)&local_170,(SDL_Surface *)0x5);
  SDL::PtrDeleterMock::gmock_surfaceDeleter
            ((MockSpec<void_(SDL_Surface_*)> *)&local_120,this_00,
             (Matcher<SDL_Surface_*> *)&local_170);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(SDL_Surface_*)>::InternalExpectedAt
            ((MockSpec<void_(SDL_Surface_*)> *)&local_120,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x115,"*ptrDeleterMock","surfaceDeleter(surfacePtr)");
  testing::internal::MatcherBase<SDL_Surface_*>::~MatcherBase
            ((MatcherBase<SDL_Surface_*> *)&local_120.matchers_);
  testing::internal::MatcherBase<SDL_Surface_*>::~MatcherBase
            ((MatcherBase<SDL_Surface_*> *)&local_170);
  ppVVar1 = &local_120.matchers_.
             super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
             .
             super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
             .
             super__Tuple_impl<2UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
             .super__Tuple_impl<3UL,_testing::Matcher<unsigned_char>_>.
             super__Head_base<3UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
             super_MatcherBase<unsigned_char>.vtable_;
  local_120.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
  .
  super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
  .super__Tuple_impl<2UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>.
  super__Tuple_impl<3UL,_testing::Matcher<unsigned_char>_>.
  super__Head_base<3UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>.vtable_ = (VTable *)0x0;
  local_120.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
  .
  super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
  .super__Tuple_impl<2UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>.
  super__Tuple_impl<3UL,_testing::Matcher<unsigned_char>_>.
  super__Head_base<3UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>.buffer_.ptr = (void *)0x0;
  local_120.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
  .
  super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
  .super__Tuple_impl<2UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>.
  super__Tuple_impl<3UL,_testing::Matcher<unsigned_char>_>.
  super__Head_base<3UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)0x0;
  local_120.function_mocker_ =
       (FunctionMocker<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
        *)ppVVar1;
  bVar5 = testing::internal::AlwaysTrue();
  if (bVar5) {
    SDLGraphicsSystem::loadTexture
              ((SDLGraphicsSystem *)&local_170,
               (string *)
               &(this->super_SDLGraphicsSystemWithCreatedWindowTests).super_SDLGraphicsSystemTests.
                system);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_120,0,
             (char *)local_120.matchers_.
                     super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
                     .
                     super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
                     .
                     super__Tuple_impl<2UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
                     .super__Tuple_impl<3UL,_testing::Matcher<unsigned_char>_>.
                     super__Head_base<3UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
                     super_MatcherBase<unsigned_char>.super_MatcherDescriberInterface.
                     _vptr_MatcherDescriberInterface,0x28b134);
  testing::Message::Message((Message *)&local_170);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_150,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x116,(char *)local_120.function_mocker_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_150,(Message *)&local_170);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_150);
  if ((long *)local_170._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_170._M_unused._M_object + 8))();
  }
  if (local_120.function_mocker_ !=
      (FunctionMocker<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
       *)ppVVar1) {
    operator_delete(local_120.function_mocker_,
                    (ulong)((long)&(local_120.matchers_.
                                    super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
                                    .
                                    super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
                                    .
                                    super__Tuple_impl<2UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_>
                                    .super__Tuple_impl<3UL,_testing::Matcher<unsigned_char>_>.
                                    super__Head_base<3UL,_testing::Matcher<unsigned_char>,_false>.
                                    _M_head_impl.super_MatcherBase<unsigned_char>.vtable_)->
                                   match_and_explain + 1));
  }
  SDLGraphicsSystemTests::expectQuitSystem((SDLGraphicsSystemTests *)this);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithCreatedWindowTests,
       throwIfSDLCreateTextureFromSurfaceFailedDuringLoadTexture)
{
    EXPECT_CALL(*sdlMock, loadBMP(texturePath))
        .WillOnce(Return(ByMove(makeSDLSurface(surfacePtr))));
    EXPECT_CALL(*sdlMock, mapRGB(Pointer(surfacePtr), 0, 255, 255))
        .WillOnce(Return(mapRGBResult));
    EXPECT_CALL(*sdlMock, setColorKey(Pointer(surfacePtr), SDL_TRUE, mapRGBResult))
        .WillOnce(Return(success));
    EXPECT_CALL(*sdlMock,
        createTextureFromSurface(Pointer(rendererPtr), Pointer(surfacePtr))
    ).WillOnce(ReturnNull());
    EXPECT_CALL(*ptrDeleterMock, surfaceDeleter(surfacePtr));
    EXPECT_THROW(system.loadTexture(texturePath), std::runtime_error);
    expectQuitSystem();
}